

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IColourImpl * Catch::anon_unknown_23::platformColourInstance(void)

{
  int iVar1;
  long *in_RAX;
  IMutableContext *pIVar2;
  undefined **ppuVar3;
  char *pcVar4;
  Ptr<const_Catch::IConfig> config;
  long *local_18;
  
  local_18 = in_RAX;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_18,pIVar2);
  if (local_18 == (long *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (**(code **)(*local_18 + 0x80))();
  }
  if (iVar1 == 0) {
    iVar1 = isatty(1);
    iVar1 = (iVar1 == 0) + 1;
  }
  if (iVar1 == 1) {
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') {
      ppuVar3 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      goto LAB_0010e299;
    }
    pcVar4 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    ppuVar3 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  else {
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      ppuVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_0010e299;
    }
    pcVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  if (iVar1 != 0) {
    __cxa_guard_release(pcVar4);
  }
LAB_0010e299:
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 0x18))();
  }
  return (IColourImpl *)ppuVar3;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }